

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-gui.cpp
# Opt level: O0

int Gui::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  bool bVar5;
  ImGuiStyle *style;
  ImGuiIO *io;
  bool err;
  SDL_DisplayMode current;
  char *glsl_version;
  void *sdl_gl_context;
  SDL_Window *in_stack_fffffffffffffd50;
  size_t in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  size_t in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  float local_288;
  float fStack_284;
  ImFontAtlas *in_stack_fffffffffffffd80;
  ImVec4 local_278;
  ImVec4 local_268;
  ImVec4 local_258;
  ImVec4 local_248;
  ImVec4 local_238;
  ImVec4 local_228;
  ImVec4 local_218;
  ImVec4 local_208;
  ImVec4 local_1f8;
  ImVec4 local_1e8;
  ImVec4 local_1d8;
  ImVec4 local_1c8;
  ImVec4 local_1b8;
  ImVec4 local_1a8;
  ImVec4 local_198;
  ImVec4 local_188;
  ImVec4 local_178;
  ImVec4 local_168;
  ImVec4 local_158;
  ImVec4 local_148;
  ImVec4 local_138;
  ImVec4 local_128;
  ImVec4 local_118;
  ImVec4 local_108;
  ImVec4 local_f8;
  ImVec4 local_e8;
  ImVec4 local_d8;
  ImVec4 local_c8;
  ImVec4 local_b8;
  ImVec4 local_a8;
  ImVec4 local_98;
  ImVec4 local_88;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImGuiStyle *local_58;
  ImGuiIO *local_50;
  undefined1 local_41;
  undefined1 local_40 [24];
  char *local_28;
  undefined8 *local_20;
  undefined4 local_18;
  undefined4 local_14;
  EVP_PKEY_CTX *local_10;
  uint7 extraout_var;
  
  local_28 = "#version 130";
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = ctx;
  SDL_GL_SetAttribute(0x14,0);
  SDL_GL_SetAttribute(0x15,1);
  SDL_GL_SetAttribute(0x11,3);
  SDL_GL_SetAttribute(0x12,0);
  SDL_GL_SetAttribute(5,1);
  SDL_GL_SetAttribute(6,0x18);
  SDL_GL_SetAttribute(7,8);
  SDL_GetCurrentDisplayMode(0,local_40);
  uVar3 = SDL_CreateWindow(local_10,0x2fff0000,0x2fff0000,local_14,local_18,0x2022);
  *local_20 = uVar3;
  uVar3 = SDL_GL_CreateContext(*local_20);
  local_20[1] = uVar3;
  SDL_GL_MakeCurrent(*local_20,local_20[1]);
  SDL_GL_SetSwapInterval(1);
  iVar1 = gl3wInit();
  local_41 = iVar1 != 0;
  bVar5 = !(bool)local_41;
  if (bVar5) {
    sdl_gl_context = (void *)0x4;
    ImGui::DebugCheckVersionAndDataLayout
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(size_t)in_stack_fffffffffffffd60
               ,in_stack_fffffffffffffd58,(size_t)in_stack_fffffffffffffd50,4,
               (size_t)in_stack_fffffffffffffd80);
    ImGui::CreateContext(in_stack_fffffffffffffd80);
    local_50 = ImGui::GetIO();
    local_58 = ImGui::GetStyle();
    local_58->AntiAliasedFill = false;
    local_58->AntiAliasedLines = false;
    local_58->WindowRounding = 0.0;
    ImVec2::ImVec2(&local_60,8.0,8.0);
    local_58->WindowPadding = local_60;
    local_58->WindowRounding = 0.0;
    ImVec2::ImVec2(&local_68,4.0,3.0);
    local_58->FramePadding = local_68;
    local_58->FrameRounding = 0.0;
    ImVec2::ImVec2(&local_70,8.0,4.0);
    local_58->ItemSpacing = local_70;
    ImVec2::ImVec2(&local_78,4.0,4.0);
    local_58->ItemInnerSpacing = local_78;
    local_58->IndentSpacing = 21.0;
    local_58->ScrollbarSize = 16.0;
    local_58->ScrollbarRounding = 9.0;
    local_58->GrabMinSize = 10.0;
    local_58->GrabRounding = 3.0;
    ImVec4::ImVec4(&local_88,1.0,1.0,1.0,1.0);
    local_58->Colors[0].x = local_88.x;
    local_58->Colors[0].y = local_88.y;
    local_58->Colors[0].z = local_88.z;
    local_58->Colors[0].w = local_88.w;
    ImVec4::ImVec4(&local_98,0.24,0.41,0.41,1.0);
    local_58->Colors[1].x = local_98.x;
    local_58->Colors[1].y = local_98.y;
    local_58->Colors[1].z = local_98.z;
    local_58->Colors[1].w = local_98.w;
    ImVec4::ImVec4(&local_a8,0.08,0.08,0.08,0.94);
    local_58->Colors[2].x = local_a8.x;
    local_58->Colors[2].y = local_a8.y;
    local_58->Colors[2].z = local_a8.z;
    local_58->Colors[2].w = local_a8.w;
    ImVec4::ImVec4(&local_b8,0.07,0.07,0.09,1.0);
    local_58->Colors[4].x = local_b8.x;
    local_58->Colors[4].y = local_b8.y;
    local_58->Colors[4].z = local_b8.z;
    local_58->Colors[4].w = local_b8.w;
    ImVec4::ImVec4(&local_c8,0.31,0.31,0.31,0.71);
    local_58->Colors[5].x = local_c8.x;
    local_58->Colors[5].y = local_c8.y;
    local_58->Colors[5].z = local_c8.z;
    local_58->Colors[5].w = local_c8.w;
    ImVec4::ImVec4(&local_d8,0.0,0.0,0.0,0.0);
    local_58->Colors[6].x = local_d8.x;
    local_58->Colors[6].y = local_d8.y;
    local_58->Colors[6].z = local_d8.z;
    local_58->Colors[6].w = local_d8.w;
    ImVec4::ImVec4(&local_e8,0.0,0.39,0.39,0.39);
    local_58->Colors[7].x = local_e8.x;
    local_58->Colors[7].y = local_e8.y;
    local_58->Colors[7].z = local_e8.z;
    local_58->Colors[7].w = local_e8.w;
    ImVec4::ImVec4(&local_f8,0.26,1.0,1.0,0.39);
    local_58->Colors[8].x = local_f8.x;
    local_58->Colors[8].y = local_f8.y;
    local_58->Colors[8].z = local_f8.z;
    local_58->Colors[8].w = local_f8.w;
    ImVec4::ImVec4(&local_108,0.0,0.78,0.0,1.0);
    local_58->Colors[9].x = local_108.x;
    local_58->Colors[9].y = local_108.y;
    local_58->Colors[9].z = local_108.z;
    local_58->Colors[9].w = local_108.w;
    ImVec4::ImVec4(&local_118,0.0,0.5,0.5,0.7);
    local_58->Colors[10].x = local_118.x;
    local_58->Colors[10].y = local_118.y;
    local_58->Colors[10].z = local_118.z;
    local_58->Colors[10].w = local_118.w;
    ImVec4::ImVec4(&local_128,0.0,0.5,0.5,1.0);
    local_58->Colors[0xc].x = local_128.x;
    local_58->Colors[0xc].y = local_128.y;
    local_58->Colors[0xc].z = local_128.z;
    local_58->Colors[0xc].w = local_128.w;
    ImVec4::ImVec4(&local_138,0.0,0.7,0.7,1.0);
    local_58->Colors[0xb].x = local_138.x;
    local_58->Colors[0xb].y = local_138.y;
    local_58->Colors[0xb].z = local_138.z;
    local_58->Colors[0xb].w = local_138.w;
    ImVec4::ImVec4(&local_148,0.0,0.7,0.7,1.0);
    local_58->Colors[0xd].x = local_148.x;
    local_58->Colors[0xd].y = local_148.y;
    local_58->Colors[0xd].z = local_148.z;
    local_58->Colors[0xd].w = local_148.w;
    ImVec4::ImVec4(&local_158,0.1,0.27,0.27,1.0);
    local_58->Colors[0xe].x = local_158.x;
    local_58->Colors[0xe].y = local_158.y;
    local_58->Colors[0xe].z = local_158.z;
    local_58->Colors[0xe].w = local_158.w;
    ImVec4::ImVec4(&local_168,0.8,0.8,0.83,0.31);
    local_58->Colors[0xf].x = local_168.x;
    local_58->Colors[0xf].y = local_168.y;
    local_58->Colors[0xf].z = local_168.z;
    local_58->Colors[0xf].w = local_168.w;
    ImVec4::ImVec4(&local_178,0.26,1.0,1.0,0.39);
    local_58->Colors[0x10].x = local_178.x;
    local_58->Colors[0x10].y = local_178.y;
    local_58->Colors[0x10].z = local_178.z;
    local_58->Colors[0x10].w = local_178.w;
    ImVec4::ImVec4(&local_188,0.0,0.78,0.0,1.0);
    local_58->Colors[0x11].x = local_188.x;
    local_58->Colors[0x11].y = local_188.y;
    local_58->Colors[0x11].z = local_188.z;
    local_58->Colors[0x11].w = local_188.w;
    ImVec4::ImVec4(&local_198,0.8,0.8,0.83,0.39);
    local_58->Colors[0x12].x = local_198.x;
    local_58->Colors[0x12].y = local_198.y;
    local_58->Colors[0x12].z = local_198.z;
    local_58->Colors[0x12].w = local_198.w;
    ImVec4::ImVec4(&local_1a8,0.8,0.8,0.83,0.39);
    local_58->Colors[0x13].x = local_1a8.x;
    local_58->Colors[0x13].y = local_1a8.y;
    local_58->Colors[0x13].z = local_1a8.z;
    local_58->Colors[0x13].w = local_1a8.w;
    ImVec4::ImVec4(&local_1b8,0.0,0.78,0.0,1.0);
    local_58->Colors[0x14].x = local_1b8.x;
    local_58->Colors[0x14].y = local_1b8.y;
    local_58->Colors[0x14].z = local_1b8.z;
    local_58->Colors[0x14].w = local_1b8.w;
    ImVec4::ImVec4(&local_1c8,0.13,0.55,0.55,1.0);
    local_58->Colors[0x15].x = local_1c8.x;
    local_58->Colors[0x15].y = local_1c8.y;
    local_58->Colors[0x15].z = local_1c8.z;
    local_58->Colors[0x15].w = local_1c8.w;
    ImVec4::ImVec4(&local_1d8,0.61,1.0,0.0,0.51);
    local_58->Colors[0x16].x = local_1d8.x;
    local_58->Colors[0x16].y = local_1d8.y;
    local_58->Colors[0x16].z = local_1d8.z;
    local_58->Colors[0x16].w = local_1d8.w;
    ImVec4::ImVec4(&local_1e8,0.0,0.78,0.0,1.0);
    local_58->Colors[0x17].x = local_1e8.x;
    local_58->Colors[0x17].y = local_1e8.y;
    local_58->Colors[0x17].z = local_1e8.z;
    local_58->Colors[0x17].w = local_1e8.w;
    ImVec4::ImVec4(&local_1f8,0.79,0.51,0.0,0.51);
    local_58->Colors[0x18].x = local_1f8.x;
    local_58->Colors[0x18].y = local_1f8.y;
    local_58->Colors[0x18].z = local_1f8.z;
    local_58->Colors[0x18].w = local_1f8.w;
    ImVec4::ImVec4(&local_208,0.79,0.51,0.0,0.67);
    local_58->Colors[0x19].x = local_208.x;
    local_58->Colors[0x19].y = local_208.y;
    local_58->Colors[0x19].z = local_208.z;
    local_58->Colors[0x19].w = local_208.w;
    ImVec4::ImVec4(&local_218,0.79,0.51,0.0,0.67);
    local_58->Colors[0x1a].x = local_218.x;
    local_58->Colors[0x1a].y = local_218.y;
    local_58->Colors[0x1a].z = local_218.z;
    local_58->Colors[0x1a].w = local_218.w;
    ImVec4::ImVec4(&local_228,0.0,0.0,0.0,0.0);
    local_58->Colors[0x1e].x = local_228.x;
    local_58->Colors[0x1e].y = local_228.y;
    local_58->Colors[0x1e].z = local_228.z;
    local_58->Colors[0x1e].w = local_228.w;
    ImVec4::ImVec4(&local_238,0.26,1.0,1.0,0.39);
    local_58->Colors[0x1f].x = local_238.x;
    local_58->Colors[0x1f].y = local_238.y;
    local_58->Colors[0x1f].z = local_238.z;
    local_58->Colors[0x1f].w = local_238.w;
    ImVec4::ImVec4(&local_248,0.0,0.78,0.0,1.0);
    local_58->Colors[0x20].x = local_248.x;
    local_58->Colors[0x20].y = local_248.y;
    local_58->Colors[0x20].z = local_248.z;
    local_58->Colors[0x20].w = local_248.w;
    ImVec4::ImVec4(&local_258,1.0,0.65,0.38,0.67);
    local_58->Colors[0x26].x = local_258.x;
    local_58->Colors[0x26].y = local_258.y;
    local_58->Colors[0x26].z = local_258.z;
    local_58->Colors[0x26].w = local_258.w;
    ImVec4::ImVec4(&local_268,0.25,1.0,0.0,1.0);
    local_58->Colors[0x27].x = local_268.x;
    local_58->Colors[0x27].y = local_268.y;
    local_58->Colors[0x27].z = local_268.z;
    local_58->Colors[0x27].w = local_268.w;
    ImVec4::ImVec4(&local_278,1.0,0.65,0.38,0.67);
    local_58->Colors[0x28].x = local_278.x;
    local_58->Colors[0x28].y = local_278.y;
    local_58->Colors[0x28].z = local_278.z;
    local_58->Colors[0x28].w = local_278.w;
    ImVec4::ImVec4((ImVec4 *)&stack0xfffffffffffffd78,0.25,1.0,0.0,1.0);
    local_58->Colors[0x29].x = local_288;
    local_58->Colors[0x29].y = fStack_284;
    *(ImFontAtlas **)&local_58->Colors[0x29].z = in_stack_fffffffffffffd80;
    ImVec4::ImVec4((ImVec4 *)&stack0xfffffffffffffd68,0.25,1.0,0.0,0.43);
    local_58->Colors[0x2a].x = (float)(int)in_stack_fffffffffffffd68;
    local_58->Colors[0x2a].y = (float)(int)(in_stack_fffffffffffffd68 >> 0x20);
    *(char **)&local_58->Colors[0x2a].z = in_stack_fffffffffffffd70;
    ImVec4::ImVec4((ImVec4 *)&stack0xfffffffffffffd58,1.0,0.98,0.95,0.78);
    local_58->Colors[0x2f].x = (float)(int)in_stack_fffffffffffffd58;
    local_58->Colors[0x2f].y = (float)(int)(in_stack_fffffffffffffd58 >> 0x20);
    *(char **)&local_58->Colors[0x2f].z = in_stack_fffffffffffffd60;
    ImGui_ImplSDL2_InitForOpenGL(in_stack_fffffffffffffd50,sdl_gl_context);
    ImGui_ImplOpenGL3_Init(in_stack_fffffffffffffd60);
    uVar4 = (ulong)extraout_var << 8;
  }
  else {
    uVar2 = fprintf(_stderr,"Failed to initialize OpenGL loader!\n");
    uVar4 = (ulong)uVar2;
  }
  return (int)CONCAT71((int7)(uVar4 >> 8),bVar5);
}

Assistant:

bool init(const char * windowTitle, int windowSizeX, int windowSizeY, Objects & objects) {
#if __APPLE__
    // GL 3.2 Core + GLSL 150
    const char* glsl_version = "#version 150";
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_FLAGS, SDL_GL_CONTEXT_FORWARD_COMPATIBLE_FLAG);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_CORE);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 3);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 2);
#elif __EMSCRIPTEN__
    const char* glsl_version = "#version 100";
    //const char* glsl_version = "#version 300 es";
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_FLAGS, 0);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_ES);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 2);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 0);
#else
    // GL 3.0 + GLSL 130
    const char* glsl_version = "#version 130";
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_FLAGS, 0);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_CORE);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 3);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 0);
#endif

    // Create window with graphics context
    SDL_GL_SetAttribute(SDL_GL_DOUBLEBUFFER, 1);
    SDL_GL_SetAttribute(SDL_GL_DEPTH_SIZE, 24);
    SDL_GL_SetAttribute(SDL_GL_STENCIL_SIZE, 8);
    SDL_DisplayMode current;
    SDL_GetCurrentDisplayMode(0, &current);

#ifdef __EMSCRIPTEN__
    SDL_Renderer *renderer;
    SDL_CreateWindowAndRenderer(windowSizeX, windowSizeY, SDL_WINDOW_OPENGL, &objects.window, &renderer);
#else
    objects.window = SDL_CreateWindow(windowTitle, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, windowSizeX, windowSizeY, SDL_WINDOW_OPENGL|SDL_WINDOW_RESIZABLE|SDL_WINDOW_ALLOW_HIGHDPI);
#endif

    objects.gl_context = SDL_GL_CreateContext(objects.window);
    SDL_GL_MakeCurrent(objects.window, objects.gl_context);
    SDL_GL_SetSwapInterval(1); // Enable vsync

    // Initialize OpenGL loader
#if defined(IMGUI_IMPL_OPENGL_LOADER_GL3W)
    bool err = gl3wInit() != 0;
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLEW)
    bool err = glewInit() != GLEW_OK;
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLAD)
    bool err = gladLoadGL() == 0;
#else
    bool err = false; // If you use IMGUI_IMPL_OPENGL_LOADER_CUSTOM, your loader is likely to requires some form of initialization.
#endif
    if (err) {
        fprintf(stderr, "Failed to initialize OpenGL loader!\n");
        return false;
    }

    // Setup Dear ImGui binding
    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO(); (void)io;
    //io.ConfigFlags |= ImGuiConfigFlags_NavEnableKeyboard;  // Enable Keyboard Controls

    ImGuiStyle & style = ImGui::GetStyle();

    style.AntiAliasedFill = false;
    style.AntiAliasedLines = false;
    style.WindowRounding = 0.0f;

    style.WindowPadding = ImVec2(8, 8);
    style.WindowRounding = 0.0f;
    style.FramePadding = ImVec2(4, 3);
    style.FrameRounding = 0.0f;
    style.ItemSpacing = ImVec2(8, 4);
    style.ItemInnerSpacing = ImVec2(4, 4);
    style.IndentSpacing = 21.0f;
    style.ScrollbarSize = 16.0f;
    style.ScrollbarRounding = 9.0f;
    style.GrabMinSize = 10.0f;
    style.GrabRounding = 3.0f;

    style.Colors[ImGuiCol_Text]                  = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    style.Colors[ImGuiCol_TextDisabled]          = ImVec4(0.24f, 0.41f, 0.41f, 1.00f);
    style.Colors[ImGuiCol_WindowBg]              = ImVec4(0.08f, 0.08f, 0.08f, 0.94f);
    //style.Colors[ImGuiCol_ChildWindowBg]         = ImVec4(0.07f, 0.07f, 0.09f, 1.00f);
    style.Colors[ImGuiCol_PopupBg]               = ImVec4(0.07f, 0.07f, 0.09f, 1.00f);
    style.Colors[ImGuiCol_Border]                = ImVec4(0.31f, 0.31f, 0.31f, 0.71f);
    style.Colors[ImGuiCol_BorderShadow]          = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_FrameBg]               = ImVec4(0.00f, 0.39f, 0.39f, 0.39f);
    style.Colors[ImGuiCol_FrameBgHovered]        = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_FrameBgActive]         = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_TitleBg]               = ImVec4(0.00f, 0.50f, 0.50f, 0.70f);
    style.Colors[ImGuiCol_TitleBgCollapsed]      = ImVec4(0.00f, 0.50f, 0.50f, 1.00f);
    style.Colors[ImGuiCol_TitleBgActive]         = ImVec4(0.00f, 0.70f, 0.70f, 1.00f);
    style.Colors[ImGuiCol_MenuBarBg]             = ImVec4(0.00f, 0.70f, 0.70f, 1.00f);
    style.Colors[ImGuiCol_ScrollbarBg]           = ImVec4(0.10f, 0.27f, 0.27f, 1.00f);
    style.Colors[ImGuiCol_ScrollbarGrab]         = ImVec4(0.80f, 0.80f, 0.83f, 0.31f);
    style.Colors[ImGuiCol_ScrollbarGrabHovered]  = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_ScrollbarGrabActive]   = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_ComboBg]               = ImVec4(0.00f, 0.39f, 0.39f, 1.00f);
    style.Colors[ImGuiCol_CheckMark]             = ImVec4(0.80f, 0.80f, 0.83f, 0.39f);
    style.Colors[ImGuiCol_SliderGrab]            = ImVec4(0.80f, 0.80f, 0.83f, 0.39f);
    style.Colors[ImGuiCol_SliderGrabActive]      = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_Button]                = ImVec4(0.13f, 0.55f, 0.55f, 1.00f);
    style.Colors[ImGuiCol_ButtonHovered]         = ImVec4(0.61f, 1.00f, 0.00f, 0.51f);
    style.Colors[ImGuiCol_ButtonActive]          = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_Header]                = ImVec4(0.79f, 0.51f, 0.00f, 0.51f);
    style.Colors[ImGuiCol_HeaderHovered]         = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_HeaderActive]          = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    //style.Colors[ImGuiCol_Column]                = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    //style.Colors[ImGuiCol_ColumnHovered]         = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_ColumnActive]          = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_ResizeGrip]            = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_ResizeGripHovered]     = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_ResizeGripActive]      = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_CloseButton]           = ImVec4(0.40f, 0.39f, 0.38f, 0.16f);
    //style.Colors[ImGuiCol_CloseButtonHovered]    = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    //style.Colors[ImGuiCol_CloseButtonActive]     = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_PlotLines]             = ImVec4(1.00f, 0.65f, 0.38f, 0.67f);
    style.Colors[ImGuiCol_PlotLinesHovered]      = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_PlotHistogram]         = ImVec4(1.00f, 0.65f, 0.38f, 0.67f);
    style.Colors[ImGuiCol_PlotHistogramHovered]  = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_TextSelectedBg]        = ImVec4(0.25f, 1.00f, 0.00f, 0.43f);
    style.Colors[ImGuiCol_ModalWindowDarkening]  = ImVec4(1.00f, 0.98f, 0.95f, 0.78f);

    ImGui_ImplSDL2_InitForOpenGL(objects.window, objects.gl_context);
    ImGui_ImplOpenGL3_Init(glsl_version);

    return true;
}